

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoapySDRProbe.cpp
# Opt level: O2

string * toString_abi_cxx11_(string *__return_storage_ptr__,Range *range)

{
  ostream *poVar1;
  stringstream ss;
  stringstream local_1a0 [16];
  ostream local_190 [376];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::operator<<(local_190,"[");
  poVar1 = std::ostream::_M_insert<double>(*(double *)range);
  std::operator<<(poVar1,", ");
  std::ostream::_M_insert<double>(*(double *)(range + 8));
  if ((*(double *)(range + 0x10) != 0.0) || (NAN(*(double *)(range + 0x10)))) {
    std::operator<<(local_190,", ");
    std::ostream::_M_insert<double>(*(double *)(range + 0x10));
  }
  std::operator<<(local_190,"]");
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

std::string toString(const SoapySDR::Range &range)
{
    std::stringstream ss;
    ss << "[" << range.minimum() << ", " << range.maximum();
    if (range.step() != 0.0) ss << ", " << range.step();
    ss << "]";
    return ss.str();
}